

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void __thiscall
CharConvByte::unpack(CharConvByte *this,vm_val_t *val,CVmDataSource *src,int cnt,char pad)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  vm_obj_id_t vVar5;
  unsigned_long uVar6;
  
  vVar5 = CVmObjByteArray::create(0,(long)cnt);
  val->typ = VM_OBJ;
  (val->val).obj = vVar5;
  pvVar4 = sp_;
  pCVar1 = G_obj_table_X.pages_[vVar5 >> 0xc];
  uVar3 = *(undefined4 *)&val->field_0x4;
  aVar2 = val->val;
  sp_ = sp_ + 1;
  pvVar4->typ = val->typ;
  *(undefined4 *)&pvVar4->field_0x4 = uVar3;
  pvVar4->val = aVar2;
  uVar6 = CVmObjByteArray::read_from_file
                    ((CVmObjByteArray *)(pCVar1 + (vVar5 & 0xfff)),(val->val).obj,src,1,(long)cnt,0)
  ;
  if ((int)uVar6 == cnt) {
    sp_ = sp_ + -1;
    return;
  }
  err_throw(0x65);
}

Assistant:

virtual void unpack(VMG_ vm_val_t *val, CVmDataSource *src, int cnt,
                        char pad)
    {
        /*
         *   For the byte type, we unpack into a ByteArray object rather than
         *   a string, and we leave any padding intact.  Create a byte array
         *   with the required size (and push it for gc protection).  
         */
        val->set_obj(CVmObjByteArray::create(vmg_ FALSE, cnt));
        CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ val->val.obj);
        G_stk->push(val);

        /* read the data (don't save undo, since it's a new object) */
        if ((int)arr->read_from_file(
            vmg_ val->val.obj, src, 1, cnt, FALSE) != cnt)
            err_throw(VMERR_READ_FILE);

        /* done with the gc protection */
        G_stk->discard();
    }